

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa_file_wrapper.cpp
# Opt level: O2

void __thiscall
salsa_file_wrapper::crypt_file
          (salsa_file_wrapper *this,string *in_file_name,string *out_file_name,bool print_process)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  size_t i;
  size_type __n;
  long lVar5;
  undefined1 *local_4d8 [2];
  undefined1 local_4c8 [16];
  block_array file_block;
  block_array crypt;
  ifstream input_file;
  int aiStack_418 [122];
  ofstream out_file;
  
  if ((this->m_cryptoman)._M_t.super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
      super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
      super__Head_base<0UL,_salsa20_*,_false>._M_head_impl == (salsa20 *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"create crypter firstly");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(&input_file,(string *)in_file_name,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::ofstream(&out_file,(string *)out_file_name,_S_out);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      salsa20::begin_crypt
                ((this->m_cryptoman)._M_t.
                 super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
                 super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
                 super__Head_base<0UL,_salsa20_*,_false>._M_head_impl);
      std::istream::seekg((long)&input_file,_S_beg);
      uVar2 = std::istream::tellg();
      std::istream::seekg((long)&input_file,_S_beg);
      while (*(int *)((long)aiStack_418 + *(long *)(_input_file + -0x18)) == 0) {
        file_block._M_elems[0x30] = '\0';
        file_block._M_elems[0x31] = '\0';
        file_block._M_elems[0x32] = '\0';
        file_block._M_elems[0x33] = '\0';
        file_block._M_elems[0x34] = '\0';
        file_block._M_elems[0x35] = '\0';
        file_block._M_elems[0x36] = '\0';
        file_block._M_elems[0x37] = '\0';
        file_block._M_elems[0x38] = '\0';
        file_block._M_elems[0x39] = '\0';
        file_block._M_elems[0x3a] = '\0';
        file_block._M_elems[0x3b] = '\0';
        file_block._M_elems[0x3c] = '\0';
        file_block._M_elems[0x3d] = '\0';
        file_block._M_elems[0x3e] = '\0';
        file_block._M_elems[0x3f] = '\0';
        file_block._M_elems[0x20] = '\0';
        file_block._M_elems[0x21] = '\0';
        file_block._M_elems[0x22] = '\0';
        file_block._M_elems[0x23] = '\0';
        file_block._M_elems[0x24] = '\0';
        file_block._M_elems[0x25] = '\0';
        file_block._M_elems[0x26] = '\0';
        file_block._M_elems[0x27] = '\0';
        file_block._M_elems[0x28] = '\0';
        file_block._M_elems[0x29] = '\0';
        file_block._M_elems[0x2a] = '\0';
        file_block._M_elems[0x2b] = '\0';
        file_block._M_elems[0x2c] = '\0';
        file_block._M_elems[0x2d] = '\0';
        file_block._M_elems[0x2e] = '\0';
        file_block._M_elems[0x2f] = '\0';
        file_block._M_elems[0x10] = '\0';
        file_block._M_elems[0x11] = '\0';
        file_block._M_elems[0x12] = '\0';
        file_block._M_elems[0x13] = '\0';
        file_block._M_elems[0x14] = '\0';
        file_block._M_elems[0x15] = '\0';
        file_block._M_elems[0x16] = '\0';
        file_block._M_elems[0x17] = '\0';
        file_block._M_elems[0x18] = '\0';
        file_block._M_elems[0x19] = '\0';
        file_block._M_elems[0x1a] = '\0';
        file_block._M_elems[0x1b] = '\0';
        file_block._M_elems[0x1c] = '\0';
        file_block._M_elems[0x1d] = '\0';
        file_block._M_elems[0x1e] = '\0';
        file_block._M_elems[0x1f] = '\0';
        file_block._M_elems[0] = '\0';
        file_block._M_elems[1] = '\0';
        file_block._M_elems[2] = '\0';
        file_block._M_elems[3] = '\0';
        file_block._M_elems[4] = '\0';
        file_block._M_elems[5] = '\0';
        file_block._M_elems[6] = '\0';
        file_block._M_elems[7] = '\0';
        file_block._M_elems[8] = '\0';
        file_block._M_elems[9] = '\0';
        file_block._M_elems[10] = '\0';
        file_block._M_elems[0xb] = '\0';
        file_block._M_elems[0xc] = '\0';
        file_block._M_elems[0xd] = '\0';
        file_block._M_elems[0xe] = '\0';
        file_block._M_elems[0xf] = '\0';
        std::istream::read((char *)&input_file,(long)&file_block);
        salsa20::process_block
                  (&crypt,(this->m_cryptoman)._M_t.
                          super___uniq_ptr_impl<salsa20,_std::default_delete<salsa20>_>._M_t.
                          super__Tuple_impl<0UL,_salsa20_*,_std::default_delete<salsa20>_>.
                          super__Head_base<0UL,_salsa20_*,_false>._M_head_impl,&file_block);
        if (*(int *)((long)aiStack_418 + *(long *)(_input_file + -0x18)) == 0) {
          for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
            std::ostream::put((char)&out_file);
          }
          if (print_process) {
            poVar3 = std::operator<<((ostream *)&std::cout,"\r");
            poVar3 = std::operator<<(poVar3,"progress: ");
            std::istream::tellg();
            poVar3 = std::ostream::_M_insert<long>((long)poVar3);
            poVar3 = std::operator<<(poVar3," / ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          }
        }
        else {
          for (__n = 0; (uVar2 & 0x3f) != __n; __n = __n + 1) {
            std::array<unsigned_char,_64UL>::at(&crypt,__n);
            std::ostream::put((char)&out_file);
          }
          if (print_process) {
            poVar3 = std::operator<<((ostream *)&std::cout,"\rfinish");
            local_4d8[0] = local_4c8;
            std::__cxx11::string::_M_construct((ulong)local_4d8,'2');
            std::operator<<(poVar3,(string *)local_4d8);
            std::__cxx11::string::~string((string *)local_4d8);
          }
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      std::ofstream::~ofstream(&out_file);
      std::ifstream::~ifstream(&input_file);
      return;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"output file not open");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"input file not open");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void salsa_file_wrapper::crypt_file(const std::string &in_file_name, const std::string &out_file_name, bool print_process)
{
    if (!m_cryptoman)
        throw std::runtime_error("create crypter firstly");

    std::ifstream input_file(in_file_name);
    if (!input_file.is_open())
        throw std::runtime_error("input file not open");

    std::ofstream out_file(out_file_name);
    if (!out_file.is_open())
        throw std::runtime_error("output file not open");

    // reset chiper
    m_cryptoman->begin_crypt();

    salsa20::block_array file_block;

    input_file.seekg (0, std::ios::end);
    uint32_t file_length = static_cast<uint32_t>(input_file.tellg());
    auto tail_size = file_length % file_block.size();
    input_file.seekg (0, std::ios::beg);

    while (input_file.good())
    {
        // clear block buffer
        file_block.fill(0x0);

        // read next data block
        input_file.read(reinterpret_cast<char *>(&file_block[0]), file_block.size());

        // encrypt block
        auto crypt = m_cryptoman->process_block(file_block);

        // copy encrypt data to out file
        if (input_file.good())
        {
            for (const auto &v : crypt)
                out_file.put(static_cast<char>(v));

            if (print_process)
                std::cout << "\r" << "progress: " << input_file.tellg() << " / " << file_length;
        }
        else
        {
            for (size_t i = 0; i < tail_size; ++i)
                out_file.put(static_cast<char>(crypt.at(i)));

            if (print_process)
                std::cout << "\rfinish" << std::string(50, ' ');
        }

    }

    // close files
    input_file.close();
    out_file.close();
}